

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

void __thiscall MeCab::anon_unknown_0::LatticeImpl::set_result(LatticeImpl *this,char *result)

{
  unsigned_short uVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  char **ppcVar8;
  char *pcVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mecab_node_t *pmVar10;
  undefined4 extraout_var_02;
  long lVar11;
  undefined4 extraout_var_04;
  iterator iVar12;
  size_t sVar13;
  long lVar14;
  char *pcVar15;
  LatticeImpl *pLVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  size_t sVar20;
  mecab_node_t *pmVar21;
  vector<char_*,_std::allocator<char_*>_> lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  surfaces;
  string sentence;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  features;
  char *cols [2];
  allocator local_f9;
  char **local_f8;
  iterator iStack_f0;
  char **local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  LatticeImpl *local_c0;
  char *local_b8;
  long local_b0;
  char local_a8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  mecab_node_t *local_78;
  ulong local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_48 [3];
  undefined4 extraout_var_03;
  
  local_c0 = this;
  iVar3 = (*(this->super_Lattice)._vptr_Lattice[0x16])();
  sVar4 = strlen(result);
  pcVar5 = Allocator<mecab_node_t,_mecab_path_t>::alloc
                     ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var,iVar3),
                      sVar4 + 1);
  strncpy(pcVar5,result,sVar4 + 1);
  local_f8 = (char **)0x0;
  iStack_f0._M_current = (char **)0x0;
  local_e8 = (char **)0x0;
  sVar4 = strlen(result);
  local_b8 = pcVar5;
  sVar6 = strlen(pcVar5);
  if (sVar4 == 0) {
    ppcVar8 = (char **)0x0;
    iVar12._M_current = (char **)0x0;
    sVar6 = 0;
  }
  else {
    pcVar19 = pcVar5 + sVar6;
    sVar13 = 0;
    do {
      for (; (pcVar15 = pcVar19, pcVar5 != pcVar19 && (pcVar15 = pcVar5, *pcVar5 != '\n'));
          pcVar5 = pcVar5 + 1) {
      }
      *pcVar15 = '\0';
      if (iStack_f0._M_current == local_e8) {
        std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                  ((vector<char*,std::allocator<char*>> *)&local_f8,iStack_f0,&local_b8);
      }
      else {
        *iStack_f0._M_current = local_b8;
        iStack_f0._M_current = iStack_f0._M_current + 1;
      }
      sVar13 = sVar13 + 1;
      ppcVar8 = local_f8;
      iVar12._M_current = iStack_f0._M_current;
      sVar6 = sVar13;
    } while ((pcVar15 != pcVar19) &&
            (local_b8 = pcVar15 + 1, sVar6 = sVar4, pcVar5 = local_b8, sVar13 != sVar4));
  }
  if (sVar6 != (long)iVar12._M_current - (long)ppcVar8 >> 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tagger.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x324);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"lsize == lines.size()",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
    die::~die((die *)&local_b8);
    ppcVar8 = local_f8;
  }
  local_b8 = local_a8;
  local_b0 = 0;
  local_a8[0] = '\0';
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (iStack_f0._M_current != ppcVar8) {
    uVar17 = 0;
    while( true ) {
      pcVar5 = ppcVar8[uVar17];
      iVar3 = strcmp("EOS",pcVar5);
      if (iVar3 == 0) break;
      sVar4 = strlen(pcVar5);
      pcVar9 = pcVar5 + sVar4;
      lVar14 = 0;
      ppcVar8 = local_48;
      pcVar19 = pcVar9;
      pcVar15 = pcVar5;
      do {
        while( true ) {
          if (pcVar5 == pcVar9) {
            *pcVar9 = '\0';
            *ppcVar8 = pcVar19;
            if (lVar14 != 1) goto LAB_00121ebe;
            goto LAB_00121e2d;
          }
          if (*pcVar5 == '\t') break;
          pcVar5 = pcVar5 + 1;
          pcVar19 = pcVar15;
        }
        *pcVar5 = '\0';
        *ppcVar8 = pcVar15;
        ppcVar8 = ppcVar8 + 1;
        lVar14 = lVar14 + 1;
        pcVar5 = pcVar5 + 1;
        pcVar19 = pcVar9;
        pcVar15 = pcVar5;
      } while (lVar14 != 2);
LAB_00121e2d:
      pcVar5 = local_48[0];
      std::__cxx11::string::append((char *)&local_b8);
      std::__cxx11::string::string((string *)&local_68,pcVar5,&local_f9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 &local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      std::__cxx11::string::string((string *)&local_68,local_48[1],&local_f9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                 &local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      uVar17 = uVar17 + 1;
      ppcVar8 = local_f8;
      if ((ulong)((long)iStack_f0._M_current - (long)local_f8 >> 3) <= uVar17) break;
    }
  }
LAB_00121ebe:
  pLVar16 = local_c0;
  if ((long)local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
      (long)local_d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tagger.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x335);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"features.size() == surfaces.size()",0x22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
    die::~die((die *)&local_68);
  }
  iVar3 = (*(pLVar16->super_Lattice)._vptr_Lattice[0x16])(pLVar16);
  pcVar5 = local_b8;
  sVar20 = local_b0 + 1;
  pcVar19 = Allocator<mecab_node_t,_mecab_path_t>::alloc
                      ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var_00,iVar3),
                       sVar20);
  strncpy(pcVar19,pcVar5,sVar20);
  (*(pLVar16->super_Lattice)._vptr_Lattice[9])(pLVar16,pcVar19);
  iVar3 = (*(pLVar16->super_Lattice)._vptr_Lattice[0x16])(pLVar16);
  lVar18 = CONCAT44(extraout_var_01,iVar3);
  pmVar10 = FreeList<mecab_node_t>::alloc(*(FreeList<mecab_node_t> **)(lVar18 + 0x18));
  *(undefined8 *)&pmVar10->wcost = 0;
  pmVar10->cost = 0;
  pmVar10->isbest = '\0';
  *(undefined3 *)&pmVar10->field_0x51 = 0;
  pmVar10->alpha = 0.0;
  pmVar10->beta = 0.0;
  pmVar10->prob = 0.0;
  pmVar10->id = 0;
  pmVar10->length = 0;
  pmVar10->rlength = 0;
  pmVar10->rcAttr = 0;
  pmVar10->lcAttr = 0;
  pmVar10->posid = 0;
  pmVar10->char_type = '\0';
  pmVar10->stat = '\0';
  pmVar10->surface = (char *)0x0;
  pmVar10->feature = (char *)0x0;
  pmVar10->rpath = (mecab_path_t *)0x0;
  pmVar10->lpath = (mecab_path_t *)0x0;
  pmVar10->enext = (mecab_node_t *)0x0;
  pmVar10->bnext = (mecab_node_t *)0x0;
  pmVar10->prev = (mecab_node_t *)0x0;
  pmVar10->next = (mecab_node_t *)0x0;
  lVar14 = *(long *)(lVar18 + 8);
  *(long *)(lVar18 + 8) = lVar14 + 1;
  pmVar10->id = (uint)lVar14;
  pmVar10->surface = "BOS/EOS";
  pmVar10->feature = "BOS/EOS";
  pmVar10->stat = '\x02';
  pmVar10->isbest = '\x01';
  iVar3 = (*(pLVar16->super_Lattice)._vptr_Lattice[0x16])(pLVar16);
  lVar18 = CONCAT44(extraout_var_02,iVar3);
  local_78 = FreeList<mecab_node_t>::alloc(*(FreeList<mecab_node_t> **)(lVar18 + 0x18));
  *(undefined8 *)&local_78->wcost = 0;
  local_78->cost = 0;
  local_78->isbest = '\0';
  *(undefined3 *)&local_78->field_0x51 = 0;
  local_78->alpha = 0.0;
  local_78->beta = 0.0;
  local_78->prob = 0.0;
  local_78->id = 0;
  local_78->length = 0;
  local_78->rlength = 0;
  local_78->rcAttr = 0;
  local_78->lcAttr = 0;
  local_78->posid = 0;
  local_78->char_type = '\0';
  local_78->stat = '\0';
  local_78->surface = (char *)0x0;
  local_78->feature = (char *)0x0;
  local_78->rpath = (mecab_path_t *)0x0;
  local_78->lpath = (mecab_path_t *)0x0;
  local_78->enext = (mecab_node_t *)0x0;
  local_78->bnext = (mecab_node_t *)0x0;
  local_78->prev = (mecab_node_t *)0x0;
  local_78->next = (mecab_node_t *)0x0;
  lVar14 = *(long *)(lVar18 + 8);
  *(long *)(lVar18 + 8) = lVar14 + 1;
  local_78->id = (uint)lVar14;
  local_78->surface = "BOS/EOS";
  local_78->feature = "BOS/EOS";
  local_78->stat = '\x03';
  local_78->isbest = '\x01';
  pmVar10->surface = pLVar16->sentence_;
  *(pLVar16->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl
   .super__Vector_impl_data._M_start = pmVar10;
  if (local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar18 = 8;
    uVar17 = 0;
    lVar14 = 0;
    pmVar21 = pmVar10;
    do {
      local_70 = uVar17;
      iVar3 = (*(pLVar16->super_Lattice)._vptr_Lattice[0x16])(pLVar16);
      lVar11 = CONCAT44(extraout_var_03,iVar3);
      pmVar10 = FreeList<mecab_node_t>::alloc(*(FreeList<mecab_node_t> **)(lVar11 + 0x18));
      *(undefined8 *)&pmVar10->wcost = 0;
      pmVar10->cost = 0;
      pmVar10->isbest = '\0';
      *(undefined3 *)&pmVar10->field_0x51 = 0;
      pmVar10->alpha = 0.0;
      pmVar10->beta = 0.0;
      pmVar10->prob = 0.0;
      pmVar10->id = 0;
      pmVar10->length = 0;
      pmVar10->rlength = 0;
      pmVar10->rcAttr = 0;
      pmVar10->lcAttr = 0;
      pmVar10->posid = 0;
      pmVar10->char_type = '\0';
      pmVar10->stat = '\0';
      pmVar10->surface = (char *)0x0;
      pmVar10->feature = (char *)0x0;
      pmVar10->rpath = (mecab_path_t *)0x0;
      pmVar10->lpath = (mecab_path_t *)0x0;
      pmVar10->enext = (mecab_node_t *)0x0;
      pmVar10->bnext = (mecab_node_t *)0x0;
      pmVar10->prev = (mecab_node_t *)0x0;
      pmVar10->next = (mecab_node_t *)0x0;
      lVar2 = *(long *)(lVar11 + 8);
      *(long *)(lVar11 + 8) = lVar2 + 1;
      pmVar10->id = (uint)lVar2;
      pmVar10->prev = pmVar21;
      pmVar21->next = pmVar10;
      pmVar10->surface = local_c0->sentence_ + lVar14;
      uVar1 = *(unsigned_short *)
               ((long)&((local_d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar18);
      pmVar10->length = uVar1;
      pmVar10->rlength = uVar1;
      pmVar10->isbest = '\x01';
      pmVar10->wcost = 0;
      iVar3 = (*(local_c0->super_Lattice)._vptr_Lattice[0x16])();
      pcVar5 = *(char **)((long)local_98.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar18 + -8);
      sVar20 = *(long *)((long)&((local_98.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar18) + 1;
      pcVar19 = Allocator<mecab_node_t,_mecab_path_t>::alloc
                          ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var_04,iVar3),
                           sVar20);
      strncpy(pcVar19,pcVar5,sVar20);
      pmVar10->feature = pcVar19;
      (local_c0->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar14] = pmVar10;
      lVar14 = lVar14 + (ulong)pmVar10->length;
      (local_c0->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar14] = pmVar10;
      uVar17 = local_70 + 1;
      lVar18 = lVar18 + 0x20;
      pLVar16 = local_c0;
      pmVar21 = pmVar10;
    } while (uVar17 < (ulong)((long)local_d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pmVar10->next = local_78;
  local_78->prev = pmVar10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if (local_f8 != (char **)0x0) {
    operator_delete(local_f8);
  }
  return;
}

Assistant:

void LatticeImpl::set_result(const char *result) {
  char *str = allocator()->strdup(result, std::strlen(result));
  std::vector<char *> lines;
  const size_t lsize = tokenize(str, "\n",
                                std::back_inserter(lines),
                                std::strlen(result));
  CHECK_DIE(lsize == lines.size());

  std::string sentence;
  std::vector<std::string> surfaces, features;
  for (size_t i = 0; i < lines.size(); ++i) {
    if (::strcmp("EOS", lines[i]) == 0) {
      break;
    }
    char *cols[2];
    if (tokenize(lines[i], "\t", cols, 2) != 2) {
      break;
    }
    sentence += cols[0];
    surfaces.push_back(cols[0]);
    features.push_back(cols[1]);
  }

  CHECK_DIE(features.size() == surfaces.size());

  set_sentence(allocator()->strdup(sentence.c_str(), sentence.size()));

  Node *bos_node = allocator()->newNode();
  bos_node->surface = const_cast<const char *>(BOS_KEY);  // dummy
  bos_node->feature = "BOS/EOS";
  bos_node->isbest = 1;
  bos_node->stat = MECAB_BOS_NODE;

  Node *eos_node = allocator()->newNode();
  eos_node->surface = const_cast<const char *>(BOS_KEY);  // dummy
  eos_node->feature = "BOS/EOS";
  eos_node->isbest = 1;
  eos_node->stat = MECAB_EOS_NODE;

  bos_node->surface = sentence_;
  end_nodes_[0] = bos_node;

  size_t offset = 0;
  Node *prev = bos_node;
  for (size_t i = 0; i < surfaces.size(); ++i) {
    Node *node = allocator()->newNode();
    node->prev = prev;
    prev->next = node;
    node->surface = sentence_ + offset;
    node->length = surfaces[i].size();
    node->rlength = surfaces[i].size();
    node->isbest = 1;
    node->stat = MECAB_NOR_NODE;
    node->wcost = 0;
    node->cost = 0;
    node->feature = allocator()->strdup(features[i].c_str(),
                                        features[i].size());
    begin_nodes_[offset] = node;
    end_nodes_[offset + node->length] = node;
    offset += node->length;
    prev = node;
  }

  prev->next = eos_node;
  eos_node->prev = prev;
}